

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ge_equals_gej(secp256k1_ge *a,secp256k1_gej *b)

{
  int iVar1;
  void *in_RSI;
  long in_RDI;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z2s;
  secp256k1_fe *in_stack_fffffffffffffef8;
  secp256k1_fe *in_stack_ffffffffffffff00;
  secp256k1_fe *in_stack_ffffffffffffff28;
  secp256k1_fe *in_stack_ffffffffffffff30;
  undefined1 local_a0 [144];
  void *local_10;
  
  if (*(int *)(in_RDI + 0x60) != *(int *)((long)in_RSI + 0x90)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xebc,"test condition failed: a->infinity == b->infinity");
    abort();
  }
  if (*(int *)(in_RDI + 0x60) == 0) {
    local_10 = in_RSI;
    secp256k1_fe_sqr(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    secp256k1_fe_mul(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(secp256k1_fe *)0x10e71f);
    memcpy(local_a0,local_10,0x30);
    secp256k1_fe_normalize_weak((secp256k1_fe *)0x10e740);
    secp256k1_fe_mul(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(secp256k1_fe *)0x10e75e);
    secp256k1_fe_mul(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(secp256k1_fe *)0x10e777);
    memcpy(&stack0xffffffffffffff00,(void *)((long)local_10 + 0x30),0x30);
    secp256k1_fe_normalize_weak((secp256k1_fe *)0x10e79c);
    iVar1 = secp256k1_fe_equal_var(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xec6,"test condition failed: secp256k1_fe_equal_var(&u1, &u2)");
      abort();
    }
    iVar1 = secp256k1_fe_equal_var(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xec7,"test condition failed: secp256k1_fe_equal_var(&s1, &s2)");
      abort();
    }
  }
  return;
}

Assistant:

static void ge_equals_gej(const secp256k1_ge *a, const secp256k1_gej *b) {
    secp256k1_fe z2s;
    secp256k1_fe u1, u2, s1, s2;
    CHECK(a->infinity == b->infinity);
    if (a->infinity) {
        return;
    }
    /* Check a.x * b.z^2 == b.x && a.y * b.z^3 == b.y, to avoid inverses. */
    secp256k1_fe_sqr(&z2s, &b->z);
    secp256k1_fe_mul(&u1, &a->x, &z2s);
    u2 = b->x; secp256k1_fe_normalize_weak(&u2);
    secp256k1_fe_mul(&s1, &a->y, &z2s); secp256k1_fe_mul(&s1, &s1, &b->z);
    s2 = b->y; secp256k1_fe_normalize_weak(&s2);
    CHECK(secp256k1_fe_equal_var(&u1, &u2));
    CHECK(secp256k1_fe_equal_var(&s1, &s2));
}